

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Semaphore>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  PlatformInterface *pPVar1;
  VkAllocationCallbacks *pVVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  Unique<vk::Handle<(vk::HandleType)4>_> *ptr;
  ProgramCollection<vk::ProgramBinary> *params_00;
  long lVar8;
  size_type __n;
  Parameters params_local;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  objects;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_1d8;
  AllocationCallbackRecorder allocRecorder;
  
  params_local = params;
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&allocRecorder,pVVar2,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar3 = Context::getDeviceInterface(context);
  pVVar4 = Context::getDevice(context);
  env.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  params_00 = context->m_progCollection;
  env.allocationCallbacks =
       &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  env.maxResourceConsumers = 1;
  env.vkp = pPVar1;
  env.vkd = pDVar3;
  env.device = pVVar4;
  env.programBinaries = params_00;
  sVar5 = getCurrentSystemMemoryUsage(&allocRecorder);
  Semaphore::create((Move<vk::Handle<(vk::HandleType)4>_> *)&local_1d8,&env,
                    (Resources *)&params_local,(Parameters *)params_00);
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8.m_data.deleter.m_device;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1d8.m_data.object.m_internal;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1d8.m_data.deleter.m_deviceIface;
  local_1d8.m_data.object.m_internal = 0;
  local_1d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_1d8);
  sVar6 = getCurrentSystemMemoryUsage(&allocRecorder);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&objects);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&allocRecorder);
  sVar5 = getSafeObjectCount(context,sVar6 - sVar5,0);
  __n = 100;
  if (sVar5 < 100) {
    __n = sVar5;
  }
  Environment::Environment(&env,context,(deUint32)__n);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::vector(&objects,__n,(allocator_type *)&allocRecorder);
  allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)context->m_testCtx->m_log;
  pVVar2 = &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pVVar2);
  std::operator<<((ostream *)pVVar2,"Creating ");
  std::ostream::_M_insert<unsigned_long>((ulong)pVVar2);
  std::operator<<((ostream *)pVVar2," ");
  pcVar7 = ::vk::getTypeName<vk::Handle<(vk::HandleType)4>>();
  std::operator<<((ostream *)pVVar2,pcVar7);
  std::operator<<((ostream *)pVVar2," objects");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&allocRecorder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pVVar2);
  for (lVar8 = 0; __n * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
    ptr = (Unique<vk::Handle<(vk::HandleType)4>_> *)operator_new(0x20);
    Semaphore::create((Move<vk::Handle<(vk::HandleType)4>_> *)&allocRecorder,&env,
                      (Resources *)&params_local,(Parameters *)params_00);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.deleter.m_device =
         (VkDevice)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnReallocation;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal =
         (deUint64)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
         (_func_int **)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData =
         (void *)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation =
         (PFN_vkAllocationFunction)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnReallocation =
         (PFN_vkReallocationFunction)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)&local_1d8,ptr)
    ;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)
               ((long)&(objects.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)&local_1d8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)&local_1d8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)4>_> *)&allocRecorder);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::clear(&objects);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocRecorder,"Ok",(allocator<char> *)&local_1d8);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&allocRecorder);
  std::__cxx11::string::~string((string *)&allocRecorder);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::~vector(&objects);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}